

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O1

t_pvalue __thiscall
xemmai::t_derived_primitive<long>::f_do_construct
          (t_derived_primitive<long> *this,t_pvalue *a_stack,size_t a_n)

{
  t_heap<xemmai::t_object> *this_00;
  ulong uVar1;
  undefined8 uVar2;
  t_queue<128UL> *this_01;
  t_queue<256UL> *this_02;
  t_object *p;
  t_object *ptVar3;
  long lVar4;
  t_object *ptVar5;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar6;
  char *pcVar7;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar8;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_00;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_01;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_02;
  size_t a_size;
  long in_FS_OFFSET;
  t_pvalue tVar9;
  
  uVar1 = *(ulong *)(a_n + 0x20);
  if ((uVar1 != 3) &&
     ((((uVar1 < 3 || (uVar1 == 4)) || (*(long *)(*(long *)(uVar1 + 0x40) + 8) == 0)) ||
      (*(undefined8 **)(*(long *)(*(long *)(uVar1 + 0x40) + 0x10) + 8) != &v__type_id<long>)))) {
    f_do_construct();
  }
  aVar8.v_integer = a_n + 0x28;
  aVar6.v_integer = uVar1 + 0x48;
  if (uVar1 < 5) {
    aVar6.v_integer = aVar8.v_integer;
  }
  uVar2 = *(undefined8 *)aVar6;
  this_00 = (t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30);
  a_size = a_stack[3].field_0.v_integer * 0x10 + 0x50;
  if (a_size < 0x81) {
    ptVar5 = *(t_object **)(in_FS_OFFSET + -0x58);
    if (ptVar5 == (t_object *)0x0) {
      ptVar5 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x90),this_00);
      ptVar3 = ptVar5->v_next;
      aVar8 = extraout_RDX_02;
    }
    else {
      ptVar3 = ptVar5->v_next;
    }
    *(t_object **)(in_FS_OFFSET + -0x58) = ptVar3;
  }
  else {
    ptVar5 = t_heap<xemmai::t_object>::f_allocate_medium(this_00,a_size);
    aVar8 = extraout_RDX;
  }
  ptVar5->v_next = (t_object *)0x0;
  lVar4 = a_stack[3].field_0.v_integer;
  if (lVar4 != 0) {
    pcVar7 = ptVar5->v_data + 8;
    do {
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7 = pcVar7 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  *(undefined8 *)ptVar5->v_data = uVar2;
  this_01 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_01->v_head = (t_object *)&a_stack[-5].field_0;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<128UL>::f_next(this_01);
    aVar8 = extraout_RDX_00;
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  ptVar5->v_type = (t_type *)a_stack;
  this_02 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_02->v_head = ptVar5;
  if (this_02->v_head == this_02->v_next) {
    t_slot::t_queue<256UL>::f_next(this_02);
    aVar8 = extraout_RDX_01;
  }
  else {
    this_02->v_head = this_02->v_head + 1;
  }
  (this->super_t_derived<xemmai::t_type_of<long>_>).super_t_type_of<long>.
  super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
  .super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
  v_this = (t_slot)ptVar5;
  tVar9.field_0.v_integer = aVar8.v_integer;
  tVar9.super_t_pointer.v_p = (t_object *)this;
  return tVar9;
}

Assistant:

t_pvalue f_do_construct(t_pvalue* a_stack, size_t a_n)
	{
		f_check<T>(a_stack[2], L"argument0");
		return this->template f_new<T>(f_as<T>(a_stack[2]));
	}